

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O0

void apply_simple_filter(equippable_filter *f,equippable_summary *s)

{
  _Bool _Var1;
  wchar_t local_24;
  wchar_t local_20;
  wchar_t j_1;
  wchar_t j;
  wchar_t i;
  equippable_summary *s_local;
  equippable_filter *f_local;
  
  s->nfilt = L'\0';
  if (f->simple == EQUIP_EXPR_AND) {
    for (j_1 = L'\0'; j_1 < s->nitems; j_1 = j_1 + L'\x01') {
      for (local_20 = L'\0'; local_20 < f->nv; local_20 = local_20 + L'\x01') {
        if (f->v[local_20].c != EQUIP_EXPR_SELECTOR) {
          __assert_fail("f->v[j].c == EQUIP_EXPR_SELECTOR",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x6bd,
                        "void apply_simple_filter(const struct equippable_filter *, struct equippable_summary *)"
                       );
        }
        _Var1 = (*f->v[local_20].s.func)(s->items + j_1,&f->v[local_20].s.ex);
        if (!_Var1) goto LAB_00244e99;
      }
      if ((s->nitems <= s->nfilt) || (s->nalloc <= s->nfilt)) {
        __assert_fail("s->nfilt < s->nitems && s->nfilt < s->nalloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0x6b8,
                      "void apply_simple_filter(const struct equippable_filter *, struct equippable_summary *)"
                     );
      }
      s->sorted_indices[s->nfilt] = j_1;
      s->nfilt = s->nfilt + L'\x01';
LAB_00244e99:
    }
  }
  else {
    if (f->simple != EQUIP_EXPR_OR) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                    ,0x6de,
                    "void apply_simple_filter(const struct equippable_filter *, struct equippable_summary *)"
                   );
    }
    for (j_1 = L'\0'; j_1 < s->nitems; j_1 = j_1 + L'\x01') {
      for (local_24 = L'\0'; local_24 < f->nv; local_24 = local_24 + L'\x01') {
        if (f->v[local_24].c != EQUIP_EXPR_SELECTOR) {
          __assert_fail("f->v[j].c == EQUIP_EXPR_SELECTOR",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x6cf,
                        "void apply_simple_filter(const struct equippable_filter *, struct equippable_summary *)"
                       );
        }
        _Var1 = (*f->v[local_24].s.func)(s->items + j_1,&f->v[local_24].s.ex);
        if (_Var1) {
          if ((s->nitems <= s->nfilt) || (s->nalloc <= s->nfilt)) {
            __assert_fail("s->nfilt < s->nitems && s->nfilt < s->nalloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                          ,0x6d3,
                          "void apply_simple_filter(const struct equippable_filter *, struct equippable_summary *)"
                         );
          }
          s->sorted_indices[s->nfilt] = j_1;
          s->nfilt = s->nfilt + L'\x01';
          break;
        }
      }
    }
  }
  s->sorted_indices[s->nfilt] = -1;
  return;
}

Assistant:

static void apply_simple_filter(const struct equippable_filter *f,
	struct equippable_summary *s)
{
	int i;

	s->nfilt = 0;
	switch (f->simple) {
	case EQUIP_EXPR_AND:
		for (i = 0; i < s->nitems; ++i) {
			int j = 0;

			while (1) {
				if (j >= f->nv) {
					assert(s->nfilt < s->nitems &&
						s->nfilt < s->nalloc);
					s->sorted_indices[s->nfilt] = i;
					++s->nfilt;
					break;
				}
				assert(f->v[j].c == EQUIP_EXPR_SELECTOR);
				if (! (*f->v[j].s.func)(s->items + i,
					&f->v[j].s.ex)) {
					break;
				}
				++j;
			}
		}
		break;

	case EQUIP_EXPR_OR:
		for (i = 0; i < s->nitems; ++i) {
			int j = 0;

			while (1) {
				if (j >= f->nv) {
					break;
				}
				assert(f->v[j].c == EQUIP_EXPR_SELECTOR);
				if ((*f->v[j].s.func)(s->items + i, 
					&f->v[j].s.ex)) {
					assert(s->nfilt < s->nitems &&
						s->nfilt < s->nalloc);
					s->sorted_indices[s->nfilt] = i;
					++s->nfilt;
					break;
				}
				++j;
			}
		}
		break;

	default:
		assert(0);
	}

	s->sorted_indices[s->nfilt] = -1;
}